

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLhandler.c
# Opt level: O2

RDL_cycleIterator * RDL_cycleIteratorNext(RDL_cycleIterator *it)

{
  RDL_data *pRVar1;
  RDL_URFinfo *pRVar2;
  RDL_cfam *pRVar3;
  RDL_sPathInfo *spi;
  uchar *dst;
  bool bVar4;
  uint uVar5;
  RDL_pathIterator *pRVar6;
  RDL_pathIterator *pRVar7;
  uint from;
  RDL_graph *pRVar8;
  RDL_cycleIterator *local_40;
  
  bVar4 = false;
  while( true ) {
    if (it == (RDL_cycleIterator *)0x0) {
      (*RDL_outputFunc)(RDL_ERROR,"Iterator is NULL!\n");
      return (RDL_cycleIterator *)0x0;
    }
    if (it->end != '\0') break;
    pRVar1 = it->data;
    uVar5 = it->bcc_index;
    pRVar2 = pRVar1->urfInfoPerBCC[uVar5];
    pRVar3 = pRVar2->URFs[it->urf_index][it->rcf_index];
    pRVar8 = pRVar1->bccGraphs->bcc_graphs[uVar5];
    spi = pRVar1->spiPerBCC[uVar5];
    if (it->it2 == (RDL_pathIterator *)0x0) {
      pRVar6 = RDL_listPaths(pRVar3->r,pRVar3->q,it->mode,pRVar8,spi);
      it->it2 = pRVar6;
    }
    else {
      RDL_pathIteratorNext(it->it2);
    }
    pRVar6 = it->it1;
    if (pRVar6 == (RDL_pathIterator *)0x0) {
      pRVar6 = RDL_listPaths(pRVar3->r,pRVar3->p,it->mode,pRVar8,spi);
      it->it1 = pRVar6;
    }
    pRVar7 = it->it2;
    if ((pRVar7->end != '\0') && (pRVar6->end == '\0')) {
      RDL_pathIteratorNext(pRVar6);
      RDL_deletePathIterator(it->it2);
      pRVar7 = RDL_listPaths(pRVar3->r,pRVar3->q,it->mode,pRVar8,spi);
      it->it2 = pRVar7;
      pRVar6 = it->it1;
    }
    if ((pRVar6->end == '\0') && (pRVar7->end == '\0')) {
      dst = it->compressed_cycle;
      memcpy(dst,pRVar6->compressed_path,(ulong)pRVar6->compressed_number);
      RDL_bitset_or_inplace(dst,pRVar7->compressed_path,pRVar7->compressed_number);
      uVar5 = pRVar3->x;
      if (pRVar6->mode == 'a') {
        if (uVar5 == 0xffffffff) goto joined_r0x001040cb;
      }
      else {
        pRVar8 = pRVar6->gra;
        from = pRVar3->p;
        if (uVar5 == 0xffffffff) {
          uVar5 = pRVar3->q;
        }
        else {
          uVar5 = RDL_edgeId(pRVar8,from,uVar5);
          RDL_bitset_set(dst,uVar5);
          pRVar8 = pRVar6->gra;
          from = pRVar3->q;
          uVar5 = pRVar3->x;
        }
        uVar5 = RDL_edgeId(pRVar8,from,uVar5);
      }
      RDL_bitset_set(dst,uVar5);
      goto joined_r0x001040cb;
    }
    if (it->rcf_index == it->rcf_index_max) {
      if (it->urf_index == it->urf_index_max) {
        if (it->bcc_index == it->bcc_index_max) {
          it->end = '\x01';
          goto joined_r0x001040cb;
        }
        uVar5 = it->bcc_index + 1;
        it->bcc_index = uVar5;
        it->urf_index = 0;
        pRVar1 = it->data;
        it->urf_index_max = pRVar1->nofURFsPerBCC[uVar5] - 1;
        it->rcf_index = 0;
        it->rcf_index_max = *pRVar1->urfInfoPerBCC[uVar5]->nofCFsPerURF - 1;
        uVar5 = (&pRVar1->bccGraphs->bcc_graphs[uVar5]->V)[it->mode != 'a'];
        free(it->compressed_cycle);
        RDL_bitset_init(&it->compressed_cycle,uVar5);
        pRVar6 = it->it1;
      }
      else {
        uVar5 = it->urf_index + 1;
        it->urf_index = uVar5;
        it->rcf_index = 0;
        it->rcf_index_max = pRVar2->nofCFsPerURF[uVar5] - 1;
      }
    }
    else {
      it->rcf_index = it->rcf_index + 1;
      it->running_rcf = it->running_rcf + 1;
    }
    RDL_deletePathIterator(pRVar6);
    it->it1 = (RDL_pathIterator *)0x0;
    RDL_deletePathIterator(it->it2);
    it->it2 = (RDL_pathIterator *)0x0;
    if (!bVar4) {
      local_40 = it;
    }
    bVar4 = true;
  }
  it = (RDL_cycleIterator *)0x0;
  (*RDL_outputFunc)(RDL_ERROR,"Cannot advance iterator at end!\n");
joined_r0x001040cb:
  if (!bVar4) {
    return it;
  }
  return local_40;
}

Assistant:

RDL_cycleIterator* RDL_cycleIteratorNext(RDL_cycleIterator* it)
{
  const RDL_URFinfo *uInfo;
  const RDL_cfam *cfam;
  const RDL_graph *gra;
  const RDL_sPathInfo *spi;
  unsigned number;

  if (it == NULL) {
    RDL_outputFunc(RDL_ERROR, "Iterator is NULL!\n");
    return NULL;
  }

  if (RDL_cycleIteratorAtEnd(it)) {
    RDL_outputFunc(RDL_ERROR, "Cannot advance iterator at end!\n");
    return NULL;
  }

  uInfo = it->data->urfInfoPerBCC[it->bcc_index];
  cfam = uInfo->URFs[it->urf_index][it->rcf_index];
  gra = it->data->bccGraphs->bcc_graphs[it->bcc_index];
  spi = it->data->spiPerBCC[it->bcc_index];

  /* first call */
  if (it->it2 == NULL) {
    it->it2 = RDL_listPaths(cfam->r, cfam->q, it->mode, gra, spi);
  }
  else {
    /* advance second iterator */
    RDL_pathIteratorNext(it->it2);
  }

  if (it->it1 == NULL) {
    it->it1 = RDL_listPaths(cfam->r, cfam->p, it->mode, gra, spi);
  }

  /* if second iterator is at end, increment first */
  if (it->it2->end) {
    /* do not increment first, if not possible! */
    if (!it->it1->end) {
      /* advance first iterator */
      RDL_pathIteratorNext(it->it1);

      /* re initialize second iterator */
      RDL_deletePathIterator(it->it2);
      it->it2 = RDL_listPaths(cfam->r, cfam->q, it->mode, gra, spi);
    }
  }

  /* if any of the iterators is STILL at the end, we have to change families */
  if (it->it1->end || it->it2->end) {
    /* if RCFs are at end */
    if (it->rcf_index == it->rcf_index_max) {
      if (it->urf_index == it->urf_index_max) {
        if (it->bcc_index == it->bcc_index_max) {
          it->end = 1;
        }
        else {
          ++it->bcc_index;
          it->urf_index = 0;
          it->urf_index_max = it->data->nofURFsPerBCC[it->bcc_index] - 1;
          it->rcf_index = 0;
          it->rcf_index_max = it->data->urfInfoPerBCC[it->bcc_index]->nofCFsPerURF[it->urf_index] - 1;
          if (it->mode == 'a') {
            number = it->data->bccGraphs->bcc_graphs[it->bcc_index]->V;
          }
          else {
            number = it->data->bccGraphs->bcc_graphs[it->bcc_index]->E;
          }
          free(it->compressed_cycle);
          RDL_bitset_init(&it->compressed_cycle, number);
          /* reset all iterators */
          RDL_deletePathIterator(it->it1);
          it->it1 = NULL;
          RDL_deletePathIterator(it->it2);
          it->it2 = NULL;
          /* now try again with new RCF */
          RDL_cycleIteratorNext(it);
        }
      }
      else {
        ++it->urf_index;
        it->rcf_index = 0;
        it->rcf_index_max = uInfo->nofCFsPerURF[it->urf_index] - 1;
        /* reset all iterators */
        RDL_deletePathIterator(it->it1);
        it->it1 = NULL;
        RDL_deletePathIterator(it->it2);
        it->it2 = NULL;
        /* now try again with new RCF */
        RDL_cycleIteratorNext(it);
      }
    }
    else {
      ++it->rcf_index;
      ++it->running_rcf;
      /* reset all iterators */
      RDL_deletePathIterator(it->it1);
      it->it1 = NULL;
      RDL_deletePathIterator(it->it2);
      it->it2 = NULL;
      /* now try again with new RCF */
      RDL_cycleIteratorNext(it);
    }
  }
  else {
    /* otherwise, a new cycle is born ... */
    RDL_combinePathsToCycle(it->compressed_cycle, it->it1, it->it2, cfam);
  }

  return it;
}